

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_SZPS(TT_ExecContext exc,FT_Long *args)

{
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  if ((int)*args == 0) {
    memcpy(&exc->zp0,&exc->twilight,0x40);
  }
  else {
    if ((int)*args != 1) {
      if (exc->pedantic_hinting == '\0') {
        return;
      }
      exc->error = 0x86;
      return;
    }
    memcpy(&exc->zp0,&exc->pts,0x40);
  }
  memcpy(&exc->zp1,&exc->zp0,0x40);
  memcpy(&exc->zp2,&exc->zp0,0x40);
  (exc->GS).gep0 = (FT_UShort)*args;
  (exc->GS).gep1 = (FT_UShort)*args;
  (exc->GS).gep2 = (FT_UShort)*args;
  return;
}

Assistant:

static void
  Ins_SZPS( TT_ExecContext  exc,
            FT_Long*        args )
  {
    switch ( (FT_Int)args[0] )
    {
    case 0:
      exc->zp0 = exc->twilight;
      break;

    case 1:
      exc->zp0 = exc->pts;
      break;

    default:
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      return;
    }

    exc->zp1 = exc->zp0;
    exc->zp2 = exc->zp0;

    exc->GS.gep0 = (FT_UShort)args[0];
    exc->GS.gep1 = (FT_UShort)args[0];
    exc->GS.gep2 = (FT_UShort)args[0];
  }